

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

string * __thiscall
iutest::internal::FormatForComparisonFailureMessage<std::complex<float>,std::complex<float>>
          (string *__return_storage_ptr__,internal *this,complex<float> *value,
          complex<float> *param_2)

{
  complex<float> *param_1_local;
  complex<float> *value_local;
  
  PrintToString<std::complex<float>>(__return_storage_ptr__,(iutest *)this,value);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string FormatForComparisonFailureMessage(const T1& value, const T2& /*other_operand*/)
{
    return PrintToString(value);
}